

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Result wabt::interp::Table::Copy
                 (Store *store,Table *dst,u32 dst_offset,Table *src,u32 src_offset,u32 size)

{
  pointer pRVar1;
  pointer pRVar2;
  ulong uVar3;
  Enum EVar4;
  ulong uVar5;
  
  pRVar1 = (dst->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(dst->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pRVar1 >> 3;
  uVar3 = (ulong)size;
  EVar4 = Error;
  if ((ulong)dst_offset <= uVar5 - uVar3 && uVar3 <= uVar5) {
    pRVar2 = (src->elements_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(src->elements_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pRVar2 >> 3;
    if (((ulong)src_offset <= uVar5 - uVar3 && uVar3 <= uVar5) &&
       (*(int *)&(dst->type_).super_ExternType.field_0xc ==
        *(int *)&(src->type_).super_ExternType.field_0xc)) {
      EVar4 = Ok;
      if (size != 0) {
        memmove(pRVar1 + dst_offset,pRVar2 + src_offset,uVar3 << 3);
        EVar4 = Ok;
      }
    }
  }
  return (Result)EVar4;
}

Assistant:

Result Table::Copy(Store& store,
                   Table& dst,
                   u32 dst_offset,
                   const Table& src,
                   u32 src_offset,
                   u32 size) {
  if (dst.IsValidRange(dst_offset, size) &&
      src.IsValidRange(src_offset, size) &&
      TypesMatch(dst.type_.element, src.type_.element)) {
    auto src_begin = src.elements_.begin() + src_offset;
    auto src_end = src_begin + size;
    auto dst_begin = dst.elements_.begin() + dst_offset;
    auto dst_end = dst_begin + size;
    if (dst.self() == src.self() && src_begin < dst_begin) {
      std::move_backward(src_begin, src_end, dst_end);
    } else {
      std::move(src_begin, src_end, dst_begin);
    }
    return Result::Ok;
  }
  return Result::Error;
}